

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_objmenu(int n,nh_objresult *pick_list)

{
  int local_1c;
  int i;
  nh_objresult *pick_list_local;
  int n_local;
  
  if ((logfile != -1) && (iflags.disable_log == '\0')) {
    if (n == -1) {
      lprintf(" o:x");
    }
    else {
      lprintf(" o:[");
      for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
        if (pick_list[local_1c].count < 0) {
          lprintf("%x:",(ulong)(uint)pick_list[local_1c].id);
        }
        else {
          lprintf("%x,%x:",(ulong)(uint)pick_list[local_1c].id,
                  (ulong)(uint)pick_list[local_1c].count);
        }
      }
      lprintf("]");
    }
  }
  return;
}

Assistant:

void log_objmenu(int n, struct nh_objresult *pick_list)
{
    int i;
    if (logfile == -1 || iflags.disable_log)
	return;
    
    if (n == -1) {
	lprintf(" o:x");
	return;
    }
    
    lprintf(" o:[");
    for (i = 0; i < n; i++) {
	if (pick_list[i].count > -1)
	    lprintf("%x,%x:", pick_list[i].id, pick_list[i].count);
	else
	    lprintf("%x:", pick_list[i].id);
    }
    
    lprintf("]");
}